

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  String local_60;
  String local_50;
  TimeInMillis local_40;
  string local_38;
  
  bVar1 = TestResult::Passed(&test_info->result_);
  local_40 = (test_info->result_).elapsed_time_;
  StreamableToString<long_long>((internal *)&local_50,&local_40);
  String::Format((char *)&local_60,"event=TestEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
                 local_50.c_str_);
  String::operator_cast_to_string(&local_38,&local_60);
  Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  String::~String(&local_60);
  String::~String(&local_50);
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    Send(String::Format(
        "event=TestEnd&passed=%d&elapsed_time=%sms\n",
        (test_info.result())->Passed(),
        StreamableToString((test_info.result())->elapsed_time()).c_str()));
  }